

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

int gpioSetGetSamplesFunc(gpioGetSamplesFunc_t f,uint32_t bits)

{
  FILE *pFVar1;
  char *pcVar2;
  uint in_ESI;
  callbk_t in_RDI;
  int local_4;
  
  pFVar1 = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
    pcVar2 = myTimeStamp();
    fprintf(pFVar1,"%s %s: function=%08X bits=%08X\n",pcVar2,"gpioSetGetSamplesFunc",
            (ulong)in_RDI & 0xffffffff,(ulong)in_ESI);
  }
  pFVar1 = _stderr;
  if (libInitialised == 0) {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar2 = myTimeStamp();
      fprintf(pFVar1,"%s %s: pigpio uninitialised, call gpioInitialise()\n",pcVar2,
              "gpioSetGetSamplesFunc");
    }
    local_4 = -0x1f;
  }
  else {
    gpioGetSamples.ex = 0;
    gpioGetSamples.userdata = (void *)0x0;
    gpioGetSamples.bits = in_ESI;
    if (in_RDI == (callbk_t)0x0) {
      gpioGetSamples.bits = 0;
    }
    monitorBits = alertBits | notifyBits | scriptBits | gpioGetSamples.bits;
    local_4 = 0;
    gpioGetSamples.func = in_RDI;
  }
  return local_4;
}

Assistant:

int gpioSetGetSamplesFunc(gpioGetSamplesFunc_t f, uint32_t bits)
{
   DBG(DBG_USER, "function=%08X bits=%08X", (uint32_t)f, bits);

   CHECK_INITED;

   gpioGetSamples.ex       = 0;
   gpioGetSamples.userdata = NULL;
   gpioGetSamples.func     = f;

   if (f) gpioGetSamples.bits = bits;
   else   gpioGetSamples.bits = 0;

   monitorBits = alertBits | notifyBits | scriptBits | gpioGetSamples.bits;

   return 0;
}